

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

WalkResult __thiscall Map::Walk(Map *this,Character *from,Direction direction,bool admin)

{
  list<Character_*,_std::allocator<Character_*>_> *plVar1;
  short id;
  World *pWVar2;
  Character *pCVar3;
  NPC *pNVar4;
  byte bVar5;
  pointer psVar6;
  pointer ppNVar7;
  pointer ppCVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  WalkResult WVar13;
  TileSpec TVar14;
  mapped_type *pmVar15;
  Map_Tile *pMVar16;
  Map *pMVar17;
  byte y;
  pointer ppNVar18;
  pointer ppCVar19;
  pointer ppNVar20;
  pointer ppNVar21;
  int i;
  vector<Character_*,_std::allocator<Character_*>_> *this_00;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_01;
  _List_node_base *p_Var22;
  byte x;
  size_t i_4;
  ulong uVar23;
  __shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *p_Var24;
  double dVar25;
  double dVar26;
  double dVar27;
  PacketBuilder builder;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> oldcoords;
  PacketBuilder rbuilder;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> newcoords;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> newitems;
  vector<NPC_*,_std::allocator<NPC_*>_> oldnpcs;
  vector<NPC_*,_std::allocator<NPC_*>_> newnpcs;
  vector<Character_*,_std::allocator<Character_*>_> oldchars;
  vector<Character_*,_std::allocator<Character_*>_> newchars;
  string local_70;
  string local_50;
  
  pWVar2 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"SeeDistance",(allocator<char> *)&rbuilder);
  pmVar15 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&builder);
  util::variant::GetInt(pmVar15);
  std::__cxx11::string::~string((string *)&builder);
  x = from->x;
  y = from->y;
  bVar9 = y;
  switch((ulong)direction) {
  case 0:
    y = y + 1;
    goto switchD_00158ee2_default;
  case 1:
    bVar10 = x - 1;
    bVar5 = x;
    break;
  case 2:
    bVar9 = y - 1;
    bVar10 = x;
    bVar5 = y;
    break;
  case 3:
    bVar10 = x + 1;
    bVar5 = x + 1;
    break;
  default:
    goto switchD_00158ee2_default;
  }
  x = bVar10;
  y = bVar9;
  if (bVar5 != 0) {
switchD_00158ee2_default:
    if ((x < this->width) && (y < this->height)) {
      if (!admin) {
        bVar11 = Walkable(this,x,y,false);
        if (!bVar11) {
          return WalkFail;
        }
        bVar11 = Occupied(this,x,y,PlayerOnly,false);
        if (bVar11) {
          dVar27 = from->last_walk;
          pWVar2 = this->world;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"GhostTimer",(allocator<char> *)&rbuilder);
          pmVar15 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->config,(key_type *)&builder);
          dVar25 = util::variant::GetFloat(pmVar15);
          dVar26 = Timer::GetTime();
          std::__cxx11::string::~string((string *)&builder);
          if (dVar26 < dVar27 + dVar25) {
            return WalkFail;
          }
        }
      }
      pMVar16 = GetTile(this,x,y);
      id = (pMVar16->warp).map;
      if (id != 0) {
        if (((pMVar16->warp).levelreq <= from->level) &&
           (((pMVar16->warp).spec == NoDoor || ((pMVar16->warp).open == true)))) {
          pMVar17 = World::GetMap(this->world,id);
          iVar12 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
          if (((char)iVar12 == '\0') &&
             ((pMVar17->evacuate_lock == true && (pMVar17->id != from->map->id)))) {
            pWVar2 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"map_evacuate_block",(allocator<char> *)&rbuilder);
            I18N::Format<>(&local_50,&pWVar2->i18n,(string *)&builder);
            (*(from->super_Command_Source)._vptr_Command_Source[6])(from,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&builder);
            Character::Refresh(from);
          }
          else {
            Character::Warp(from,(pMVar16->warp).map,(pMVar16->warp).x,(pMVar16->warp).y,
                            WARP_ANIMATION_NONE);
          }
          return WalkWarped;
        }
        if (!admin) {
          return WalkFail;
        }
      }
      dVar27 = Timer::GetTime();
      from->last_walk = dVar27;
      from->attacks = 0;
      Character::CancelSpell(from);
      from->direction = direction;
      from->x = x;
      from->y = y;
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      oldcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      oldcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      oldcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      newitems.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      newitems.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      newitems.
      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (direction < 4) {
        WVar13 = (*(code *)(&DAT_00185760 + *(int *)(&DAT_00185760 + (ulong)direction * 4)))();
        return WVar13;
      }
      plVar1 = &this->characters;
      p_Var22 = (_List_node_base *)plVar1;
      while (p_Var22 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var22->_M_next)
                       ->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var22 != (_List_node_base *)plVar1) {
        builder._0_8_ = p_Var22[1]._M_next;
        if ((Character *)builder._0_8_ != from) {
          for (uVar23 = 0;
              uVar23 < (ulong)((long)oldcoords.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)oldcoords.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar23 = uVar23 + 1) {
            if (((oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar23].first ==
                  (uint)*(byte *)(builder._0_8_ + 0xc0)) &&
                (this_00 = &oldchars,
                oldcoords.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].second ==
                (uint)*(byte *)(builder._0_8_ + 0xc1))) ||
               ((newcoords.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar23].first ==
                 (uint)*(byte *)(builder._0_8_ + 0xc0) &&
                (this_00 = &newchars,
                newcoords.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].second ==
                (uint)*(byte *)(builder._0_8_ + 0xc1))))) {
              std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                        (this_00,(value_type *)&builder);
            }
          }
        }
      }
      ppNVar20 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (ppNVar18 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppNVar18 != ppNVar20;
          ppNVar18 = ppNVar18 + 1) {
        builder._0_8_ = *ppNVar18;
        if (((NPC *)builder._0_8_)->alive == true) {
          for (uVar23 = 0;
              uVar23 < (ulong)((long)oldcoords.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)oldcoords.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar23 = uVar23 + 1) {
            if (((oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar23].first ==
                  (uint)*(byte *)(builder._0_8_ + 2)) &&
                (this_01 = &oldnpcs,
                oldcoords.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].second ==
                (uint)*(byte *)(builder._0_8_ + 3))) ||
               ((newcoords.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar23].first ==
                 (uint)*(byte *)(builder._0_8_ + 2) &&
                (this_01 = &newnpcs,
                newcoords.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23].second ==
                (uint)*(byte *)(builder._0_8_ + 3))))) {
              std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(this_01,(value_type *)&builder);
            }
          }
        }
      }
      p_Var22 = (_List_node_base *)&this->items;
      while (p_Var22 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                          *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var22 != (_List_node_base *)&this->items) {
        std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&builder,
                   (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var22 + 1));
        for (uVar23 = 0;
            uVar23 < (ulong)((long)oldcoords.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)oldcoords.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar23 = uVar23 + 1) {
          if ((newcoords.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar23].first ==
               (uint)*(byte *)(builder._0_8_ + 8)) &&
             (newcoords.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar23].second == (uint)*(byte *)(builder._0_8_ + 9)
             )) {
            std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
            push_back(&newitems,(value_type *)&builder);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&builder.data);
      }
      PacketBuilder::PacketBuilder(&builder,PACKET_AVATAR,PACKET_REMOVE,2);
      iVar12 = Character::PlayerID(from);
      PacketBuilder::AddShort(&builder,iVar12);
      ppCVar8 = oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar19 = oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                      .super__Vector_impl_data._M_start; ppCVar19 != ppCVar8;
          ppCVar19 = ppCVar19 + 1) {
        pCVar3 = *ppCVar19;
        PacketBuilder::PacketBuilder(&rbuilder,PACKET_AVATAR,PACKET_REMOVE,2);
        iVar12 = Character::PlayerID(pCVar3);
        PacketBuilder::AddShort(&rbuilder,iVar12);
        Character::Send(pCVar3,&builder);
        Character::Send(from,&rbuilder);
        PacketBuilder::~PacketBuilder(&rbuilder);
      }
      PacketBuilder::Reset(&builder,0x3e);
      PacketBuilder::SetID(&builder,PACKET_PLAYERS,PACKET_AGREE);
      PacketBuilder::AddByte(&builder,0xff);
      (*(from->super_Command_Source)._vptr_Command_Source[2])(&rbuilder,from);
      PacketBuilder::AddBreakString(&builder,(string *)&rbuilder,0xff);
      std::__cxx11::string::~string((string *)&rbuilder);
      iVar12 = Character::PlayerID(from);
      PacketBuilder::AddShort(&builder,iVar12);
      PacketBuilder::AddShort(&builder,(int)from->mapid);
      PacketBuilder::AddShort(&builder,(uint)from->x);
      PacketBuilder::AddShort(&builder,(uint)from->y);
      PacketBuilder::AddChar(&builder,(uint)from->direction);
      PacketBuilder::AddChar(&builder,6);
      Character::PaddedGuildTag_abi_cxx11_((string *)&rbuilder,from);
      PacketBuilder::AddString(&builder,(string *)&rbuilder);
      std::__cxx11::string::~string((string *)&rbuilder);
      PacketBuilder::AddChar(&builder,(uint)from->level);
      PacketBuilder::AddChar(&builder,(uint)from->gender);
      PacketBuilder::AddChar(&builder,(uint)from->hairstyle);
      PacketBuilder::AddChar(&builder,(uint)from->haircolor);
      PacketBuilder::AddChar(&builder,(uint)from->race);
      PacketBuilder::AddShort(&builder,from->maxhp);
      PacketBuilder::AddShort(&builder,from->hp);
      PacketBuilder::AddShort(&builder,from->maxtp);
      PacketBuilder::AddShort(&builder,from->tp);
      Character::AddPaperdollData(from,&builder,"B000A0HSW");
      PacketBuilder::AddChar(&builder,(uint)from->sitting);
      PacketBuilder::AddChar(&builder,from->hidden & 1);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddChar(&builder,1);
      ppCVar8 = newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      WVar13 = WalkOK;
      for (ppCVar19 = newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                      .super__Vector_impl_data._M_start; ppCVar19 != ppCVar8;
          ppCVar19 = ppCVar19 + 1) {
        pCVar3 = *ppCVar19;
        PacketBuilder::PacketBuilder(&rbuilder,PACKET_PLAYERS,PACKET_AGREE,0x3e);
        PacketBuilder::AddByte(&rbuilder,0xff);
        (*(pCVar3->super_Command_Source)._vptr_Command_Source[2])(&local_70,pCVar3);
        PacketBuilder::AddBreakString(&rbuilder,&local_70,0xff);
        std::__cxx11::string::~string((string *)&local_70);
        iVar12 = Character::PlayerID(pCVar3);
        PacketBuilder::AddShort(&rbuilder,iVar12);
        PacketBuilder::AddShort(&rbuilder,(int)pCVar3->mapid);
        PacketBuilder::AddShort(&rbuilder,(uint)pCVar3->x);
        PacketBuilder::AddShort(&rbuilder,(uint)pCVar3->y);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->direction);
        PacketBuilder::AddChar(&rbuilder,6);
        Character::PaddedGuildTag_abi_cxx11_(&local_70,pCVar3);
        PacketBuilder::AddString(&rbuilder,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->level);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->gender);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->hairstyle);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->haircolor);
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->race);
        PacketBuilder::AddShort(&rbuilder,pCVar3->maxhp);
        PacketBuilder::AddShort(&rbuilder,pCVar3->hp);
        PacketBuilder::AddShort(&rbuilder,pCVar3->maxtp);
        PacketBuilder::AddShort(&rbuilder,pCVar3->tp);
        Character::AddPaperdollData(pCVar3,&rbuilder,"B000A0HSW");
        PacketBuilder::AddChar(&rbuilder,(uint)pCVar3->sitting);
        PacketBuilder::AddChar(&rbuilder,pCVar3->hidden & 1);
        PacketBuilder::AddByte(&rbuilder,0xff);
        PacketBuilder::AddChar(&rbuilder,1);
        Character::Send(pCVar3,&builder);
        Character::Send(from,&rbuilder);
        PacketBuilder::~PacketBuilder(&rbuilder);
      }
      PacketBuilder::Reset(&builder,5);
      PacketBuilder::SetID(&builder,PACKET_WALK,PACKET_PLAYER);
      iVar12 = Character::PlayerID(from);
      PacketBuilder::AddShort(&builder,iVar12);
      PacketBuilder::AddChar(&builder,(uint)direction);
      PacketBuilder::AddChar(&builder,(uint)from->x);
      PacketBuilder::AddChar(&builder,(uint)from->y);
      p_Var22 = (_List_node_base *)plVar1;
      while (p_Var22 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var22->_M_next)
                       ->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var22 != (_List_node_base *)plVar1) {
        pCVar3 = (Character *)p_Var22[1]._M_next;
        if ((pCVar3 != from) && (bVar11 = Character::InRange(from,pCVar3), bVar11)) {
          Character::Send(pCVar3,&builder);
        }
      }
      PacketBuilder::Reset
                (&builder,((long)newitems.
                                 super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)newitems.
                                 super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 2);
      PacketBuilder::SetID(&builder,PACKET_WALK,PACKET_REPLY);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddByte(&builder,0xff);
      psVar6 = newitems.
               super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var24 = &(newitems.
                       super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
          p_Var24 != &psVar6->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
          p_Var24 = p_Var24 + 1) {
        std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&rbuilder,p_Var24);
        PacketBuilder::AddShort(&builder,(int)*(short *)rbuilder._0_8_);
        PacketBuilder::AddShort(&builder,(int)*(short *)(rbuilder._0_8_ + 2));
        PacketBuilder::AddChar(&builder,(uint)*(byte *)(rbuilder._0_8_ + 8));
        PacketBuilder::AddChar(&builder,(uint)*(byte *)(rbuilder._0_8_ + 9));
        PacketBuilder::AddThree(&builder,*(int *)(rbuilder._0_8_ + 4));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rbuilder.data);
      }
      Character::Send(from,&builder);
      PacketBuilder::SetID(&builder,PACKET_RANGE,PACKET_REPLY);
      ppNVar18 = newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (ppNVar20 = newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          ppNVar7 = oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,
          ppNVar21 = oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                     super__Vector_impl_data._M_start, ppNVar20 != ppNVar18; ppNVar20 = ppNVar20 + 1
          ) {
        pNVar4 = *ppNVar20;
        PacketBuilder::Reset(&builder,8);
        PacketBuilder::AddChar(&builder,0);
        PacketBuilder::AddByte(&builder,0xff);
        PacketBuilder::AddChar(&builder,(uint)pNVar4->index);
        PacketBuilder::AddShort(&builder,pNVar4->id);
        PacketBuilder::AddChar(&builder,(uint)pNVar4->x);
        PacketBuilder::AddChar(&builder,(uint)pNVar4->y);
        PacketBuilder::AddChar(&builder,(uint)pNVar4->direction);
        Character::Send(from,&builder);
      }
      for (; ppNVar21 != ppNVar7; ppNVar21 = ppNVar21 + 1) {
        NPC::RemoveFromView(*ppNVar21,from);
      }
      Character::CheckQuestRules(from);
      TVar14 = GetSpec(this,from->x,from->y);
      pWVar2 = this->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rbuilder,"SpikeDamage",(allocator<char> *)&local_70);
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar2->config,(key_type *)&rbuilder);
      dVar27 = util::variant::GetFloat(pmVar15);
      std::__cxx11::string::~string((string *)&rbuilder);
      if (((((uint)(TVar14 + ~Spikes1) < 2) && (0.0 < dVar27)) && ((from->hidden & 1) == 0)) &&
         (Character::SpikeDamage(from,(int)(dVar27 * (double)from->maxhp)), from->hp == 0)) {
        Character::DeathRespawn(from);
        WVar13 = WalkWarped;
      }
      PacketBuilder::~PacketBuilder(&builder);
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
                (&newitems);
      std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
                (&oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>);
      std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
                (&newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>);
      std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
                (&oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
      std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
                (&newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&newcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      return WVar13;
    }
  }
  return WalkFail;
}

Assistant:

Map::WalkResult Map::Walk(Character *from, Direction direction, bool admin)
{
	int seedistance = this->world->config["SeeDistance"];

	unsigned char target_x = from->x;
	unsigned char target_y = from->y;

	switch (direction)
	{
		case DIRECTION_UP:
			target_y -= 1;

			if (target_y > from->y)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_RIGHT:
			target_x += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_DOWN:
			target_y += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_LEFT:
			target_x -= 1;

			if (target_x > from->x)
			{
				return WalkFail;
			}

			break;
	}

	if (!this->InBounds(target_x, target_y))
		return WalkFail;

	if (!admin)
	{
		if (!this->Walkable(target_x, target_y))
			return WalkFail;

		if (this->Occupied(target_x, target_y, PlayerOnly) && (from->last_walk + double(this->world->config["GhostTimer"]) > Timer::GetTime()))
			return WalkFail;
	}

	const Map_Warp& warp = this->GetWarp(target_x, target_y);

	if (warp)
	{
		if (from->level >= warp.levelreq && (warp.spec == Map_Warp::NoDoor || warp.open))
		{
			Map* map = this->world->GetMap(warp.map);
			if (from->SourceAccess() < ADMIN_GUIDE && map->evacuate_lock && map->id != from->map->id)
			{
				from->StatusMsg(this->world->i18n.Format("map_evacuate_block"));
				from->Refresh();
			}
			else
			{
				from->Warp(warp.map, warp.x, warp.y);
			}

			return WalkWarped;
		}

		if (!admin)
			return WalkFail;
	}

    from->last_walk = Timer::GetTime();
    from->attacks = 0;
    from->CancelSpell();

	from->direction = direction;

	from->x = target_x;
	from->y = target_y;

	int newx;
	int newy;
	int oldx;
	int oldy;

	std::vector<std::pair<int, int>> newcoords;
	std::vector<std::pair<int, int>> oldcoords;

	std::vector<Character *> newchars;
	std::vector<Character *> oldchars;
	std::vector<NPC *> newnpcs;
	std::vector<NPC *> oldnpcs;
	std::vector<std::shared_ptr<Map_Item>> newitems;

	switch (direction)
	{
		case DIRECTION_UP:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y - seedistance + std::abs(i);
				newx = from->x + i;
				oldy = from->y + seedistance + 1 - std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_RIGHT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x + seedistance - std::abs(i);
				newy = from->y + i;
				oldx = from->x - seedistance - 1 + std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_DOWN:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y + seedistance - std::abs(i);
				newx = from->x + i;
				oldy = from->y - seedistance - 1 + std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_LEFT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x - seedistance + std::abs(i);
				newy = from->y + i;
				oldx = from->x + seedistance + 1 - std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

	}

	UTIL_FOREACH(this->characters, checkchar)
	{
		if (checkchar == from)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkchar->x == oldcoords[i].first && checkchar->y == oldcoords[i].second)
			{
				oldchars.push_back(checkchar);
			}
			else if (checkchar->x == newcoords[i].first && checkchar->y == newcoords[i].second)
			{
				newchars.push_back(checkchar);
			}
		}
	}

	UTIL_FOREACH(this->npcs, checknpc)
	{
		if (!checknpc->alive)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checknpc->x == oldcoords[i].first && checknpc->y == oldcoords[i].second)
			{
				oldnpcs.push_back(checknpc);
			}
			else if (checknpc->x == newcoords[i].first && checknpc->y == newcoords[i].second)
			{
				newnpcs.push_back(checknpc);
			}
		}
	}

	UTIL_FOREACH(this->items, checkitem)
	{
		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkitem->x == newcoords[i].first && checkitem->y == newcoords[i].second)
			{
				newitems.push_back(checkitem);
			}
		}
	}

	PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 2);
	builder.AddShort(from->PlayerID());

	UTIL_FOREACH(oldchars, character)
	{
		PacketBuilder rbuilder(PACKET_AVATAR, PACKET_REMOVE, 2);
		rbuilder.AddShort(character->PlayerID());

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(62);
	builder.SetID(PACKET_PLAYERS, PACKET_AGREE);

	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->mapid);
	builder.AddShort(from->x);
	builder.AddShort(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(6); // ?
	builder.AddString(from->PaddedGuildTag());
	builder.AddChar(from->level);
	builder.AddChar(from->gender);
	builder.AddChar(from->hairstyle);
	builder.AddChar(from->haircolor);
	builder.AddChar(from->race);
	builder.AddShort(from->maxhp);
	builder.AddShort(from->hp);
	builder.AddShort(from->maxtp);
	builder.AddShort(from->tp);
	// equipment
	from->AddPaperdollData(builder, "B000A0HSW");
	builder.AddChar(from->sitting);
	builder.AddChar(from->IsHideInvisible());
	builder.AddByte(255);
	builder.AddChar(1); // 0 = NPC, 1 = player

	UTIL_FOREACH(newchars, character)
	{
		PacketBuilder rbuilder(PACKET_PLAYERS, PACKET_AGREE, 62);
		rbuilder.AddByte(255);
		rbuilder.AddBreakString(character->SourceName());
		rbuilder.AddShort(character->PlayerID());
		rbuilder.AddShort(character->mapid);
		rbuilder.AddShort(character->x);
		rbuilder.AddShort(character->y);
		rbuilder.AddChar(character->direction);
		rbuilder.AddChar(6); // ?
		rbuilder.AddString(character->PaddedGuildTag());
		rbuilder.AddChar(character->level);
		rbuilder.AddChar(character->gender);
		rbuilder.AddChar(character->hairstyle);
		rbuilder.AddChar(character->haircolor);
		rbuilder.AddChar(character->race);
		rbuilder.AddShort(character->maxhp);
		rbuilder.AddShort(character->hp);
		rbuilder.AddShort(character->maxtp);
		rbuilder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(rbuilder, "B000A0HSW");

		rbuilder.AddChar(character->sitting);
		rbuilder.AddChar(character->IsHideInvisible());
		rbuilder.AddByte(255);
		rbuilder.AddChar(1); // 0 = NPC, 1 = player

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(5);
	builder.SetID(PACKET_WALK, PACKET_PLAYER);

	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	builder.Reset(2 + newitems.size() * 9);
	builder.SetID(PACKET_WALK, PACKET_REPLY);

	builder.AddByte(255);
	builder.AddByte(255);
	UTIL_FOREACH(newitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}
	from->Send(builder);

	builder.SetID(PACKET_RANGE, PACKET_REPLY);
	UTIL_FOREACH(newnpcs, npc)
	{
		builder.Reset(8);
		builder.AddChar(0);
		builder.AddByte(255);
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);

		from->Send(builder);
	}

	UTIL_FOREACH(oldnpcs, npc)
	{
		npc->RemoveFromView(from);
	}

	from->CheckQuestRules();

	Map_Tile::TileSpec spec = this->GetSpec(from->x, from->y);

	double spike_damage = this->world->config["SpikeDamage"];

	if (spike_damage > 0.0 && (spec == Map_Tile::Spikes2 || spec == Map_Tile::Spikes3) && !from->IsHideInvisible())
	{
		int amount = from->maxhp * spike_damage;

		from->SpikeDamage(amount);

		if (from->hp == 0)
		{
			from->DeathRespawn();
			return WalkWarped;
		}	
	}

	return WalkOK;
}